

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O3

void __thiscall SSM::ECUPort::ECUPort(ECUPort *this,string *device_file_path)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  DeviceException *this_00;
  int *piVar4;
  char *__s;
  allocator_type local_59;
  Bytes local_58;
  string local_40;
  
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = open((device_file_path->_M_dataplus)._M_p,2);
  this->m_file = iVar3;
  if (-1 < iVar3) {
    configurePort(&this->m_file);
    ECUInit(&local_58,this);
    pbVar1 = (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pbVar1 != (pointer)0x0) {
      operator_delete(pbVar1,(long)pbVar2 - (long)pbVar1);
      if (local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    pbVar1 = (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::vector<std::byte,std::allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_58,
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )(pbVar1 + 5),
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )(pbVar1 + 10),&local_59);
    pbVar1 = (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar2 = (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pbVar1 != (pointer)0x0) {
      operator_delete(pbVar1,(long)pbVar2 - (long)pbVar1);
      if (local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    return;
  }
  this_00 = (DeviceException *)__cxa_allocate_exception(0x28);
  piVar4 = __errno_location();
  __s = strerror(*piVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,__s,(allocator<char> *)&local_58);
  DeviceException::DeviceException(this_00,&local_40);
  __cxa_throw(this_00,&DeviceException::typeinfo,Exception::~Exception);
}

Assistant:

ECUPort::ECUPort(const std::string& device_file_path)
  {
    // Open device file
    m_file = open(device_file_path.c_str(), O_RDWR);
    if (m_file<0) throw(DeviceException(strerror(errno)));

    // Configure port
    configurePort(m_file);

    // Initialize communication with ECU
    m_init_response = ECUInit();

    // The ECU identifier is part of the response. 
    Bytes::const_iterator it = skipToData(m_init_response);
    m_ecu_id = Bytes(it, it+5);
  }